

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.c
# Opt level: O0

DH * PEM_read_bio_DHparams(BIO *bp,DH **x,undefined1 *cb,void *u)

{
  int iVar1;
  DH *ret;
  long len;
  uchar *data;
  uchar *p;
  char *nm;
  undefined4 local_48;
  int in_stack_ffffffffffffffbc;
  uchar *file;
  uchar *length;
  uchar **pp;
  DH *local_8;
  
  pp = (uchar **)0x0;
  file = (uchar *)0x0;
  iVar1 = PEM_bytes_read_bio((uchar **)&stack0xffffffffffffffc0,(long *)&local_48,
                             (char **)&stack0xffffffffffffffd0,"DH PARAMETERS",bp,cb,u);
  if (iVar1 == 0) {
    local_8 = (DH *)0x0;
  }
  else {
    length = file;
    iVar1 = strcmp((char *)pp,"X9.42 DH PARAMETERS");
    if (iVar1 == 0) {
      local_8 = d2i_DHxparams((DH **)u,pp,(long)length);
    }
    else {
      local_8 = (DH *)d2i_DHparams(x,(uchar **)&stack0xffffffffffffffc8,
                                   CONCAT44(in_stack_ffffffffffffffbc,local_48));
    }
    if (local_8 == (DH *)0x0) {
      ERR_new();
      ERR_set_debug((char *)file,in_stack_ffffffffffffffbc,(char *)local_8);
      ERR_set_error(9,0x8000d,(char *)0x0);
    }
    CRYPTO_free(pp);
    CRYPTO_free(file);
  }
  return (DH *)local_8;
}

Assistant:

DH *PEM_read_bio_DHparams(BIO *bp, DH **x, pem_password_cb *cb, void *u)
{
    char *nm = NULL;
    const unsigned char *p = NULL;
    unsigned char *data = NULL;
    long len;
    DH *ret = NULL;

    if (!PEM_bytes_read_bio(&data, &len, &nm, PEM_STRING_DHPARAMS, bp, cb, u))
        return NULL;
    p = data;

    if (strcmp(nm, PEM_STRING_DHXPARAMS) == 0)
        ret = d2i_DHxparams(x, &p, len);
    else
        ret = d2i_DHparams(x, &p, len);

    if (ret == NULL)
        ERR_raise(ERR_LIB_PEM, ERR_R_ASN1_LIB);
    OPENSSL_free(nm);
    OPENSSL_free(data);
    return ret;
}